

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::prepareNextTestCase
          (LengthOfVectorAndMatrixTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  pointer ptVar1;
  GLchar *pGVar2;
  ulong uVar3;
  undefined1 local_198 [384];
  
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    this->m_current_test_case_index = 0;
  }
  else {
    ptVar1 = (this->m_test_cases).
             super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)test_case_index;
    if ((ulong)(((long)(this->m_test_cases).
                       super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1) / 0xc) <= uVar3) {
      return false;
    }
    local_198._0_8_ = *(undefined8 *)(**(long **)&this->field_0x70 + 0x10);
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Tested type: ");
    pGVar2 = Utils::getTypeName(ptVar1[uVar3].m_type,ptVar1[uVar3].m_n_cols,ptVar1[uVar3].m_n_rows);
    std::operator<<((ostream *)this_00,pGVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return true;
}

Assistant:

bool LengthOfVectorAndMatrixTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		m_current_test_case_index = 0;
		return true;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const testCase& test_case = m_test_cases[m_current_test_case_index];

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Tested type: "
										<< Utils::getTypeName(test_case.m_type, test_case.m_n_cols, test_case.m_n_rows)
										<< tcu::TestLog::EndMessage;

	return true;
}